

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerBrCMem
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool noMathFastPath,bool isHelper)

{
  Instr *pIVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  HelperCallOpnd *src1Opnd;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *pIVar7;
  BailOutInfo *pBVar8;
  JnHelperMethod fnHelper;
  byte local_44;
  bool local_31 [8];
  bool isHelper_local;
  
  pIVar1 = instr->m_prev;
  local_31[0] = isHelper;
  if ((instr->m_src1 == (Opnd *)0x0) || (instr->m_src2 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x29e4,"(instr->GetSrc1() != nullptr && instr->GetSrc2() != nullptr)",
                       "Expected 2 src opnds on BrC");
    if (!bVar3) goto LAB_005bccdc;
    *puVar5 = 0;
  }
  if (!noMathFastPath) {
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar3) goto LAB_005bccdc;
      *puVar5 = 0;
    }
    bVar3 = GenerateFastCondBranch(this,(BranchInstr *)instr,local_31);
    if (!bVar3) {
      return pIVar1;
    }
  }
  if (helperMethod == HelperOp_NotStrictEqual) {
    fnHelper = HelperOp_StrictEqual;
LAB_005bc9fa:
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar3) goto LAB_005bccdc;
      *puVar5 = 0;
    }
    IR::BranchInstr::Invert((BranchInstr *)instr);
    local_44 = 1;
  }
  else {
    if (helperMethod == HelperOp_NotEqual) {
      fnHelper = HelperOp_Equal;
      goto LAB_005bc9fa;
    }
    local_44 = 0;
    fnHelper = helperMethod;
  }
  if (helperMethod - HelperOp_NotStrictEqual < 0xfffffffe) {
    LoadScriptContext(this,instr);
  }
  pOVar6 = IR::Instr::UnlinkSrc2(instr);
  if (helperMethod != HelperOp_StrictEqualEmptyString) {
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar6);
  }
  pOVar6 = IR::Instr::UnlinkSrc1(instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar6);
  src1Opnd = IR::HelperCallOpnd::New(fnHelper,this->m_func);
  sym = StackSym::New(TyInt64,this->m_func);
  dstOpnd = IR::RegOpnd::New(sym,TyInt64,this->m_func);
  pIVar7 = IR::Instr::New(Call,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar7);
  pIVar7 = LowererMD::LowerCall(&this->m_lowererMD,pIVar7,0);
  if (instr->m_opcode - 0x198 < 4) {
    local_44 = 1;
  }
  else if ((instr->m_opcode - 0x194 < 4) && ((instr->field_0x38 & 0x10) != 0)) {
    pBVar8 = IR::Instr::GetBailOutInfo(instr);
    pBVar8->isInvertedBranch = true;
  }
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005bccdc;
    *puVar5 = 0;
  }
  func = instr->m_func;
  if ((dstOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_005bccdc;
    *puVar5 = 0;
  }
  bVar4 = (dstOpnd->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    dstOpnd = (RegOpnd *)IR::Opnd::Copy(&dstOpnd->super_Opnd,func);
    bVar4 = (dstOpnd->super_Opnd).field_0xb;
  }
  (dstOpnd->super_Opnd).field_0xb = bVar4 | 2;
  instr->m_src1 = &dstOpnd->super_Opnd;
  instr->m_opcode = local_44 ^ BrTrue_A;
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar3) {
LAB_005bccdc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  LowerCondBranchCheckBailOut
            (this,(BranchInstr *)instr,pIVar7,(bool)(!noMathFastPath & local_31[0]));
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBrCMem(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool noMathFastPath, bool isHelper)
{
    IR::Instr * instrPrev = instr->m_prev;
    IR::Instr * instrCall;
    IR::HelperCallOpnd  * opndHelper;
    IR::Opnd  * opndSrc;
    IR::Opnd  * opndDst;
    StackSym * symDst;
    bool inverted = false;

    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() != nullptr, "Expected 2 src opnds on BrC");

    if (!noMathFastPath && !this->GenerateFastCondBranch(instr->AsBranchInstr(), &isHelper))
    {
        return instrPrev;
    }

    // Push the args in reverse order.
    const bool loadScriptContext = !(helperMethod == IR::HelperOp_StrictEqualString || helperMethod == IR::HelperOp_StrictEqualEmptyString);
    const bool loadArg2 = !(helperMethod == IR::HelperOp_StrictEqualEmptyString);

    if (helperMethod == IR::HelperOp_NotEqual)
    {
        // Op_NotEqual() returns !Op_Equal().  It is faster to call Op_Equal() directly.
        helperMethod = IR::HelperOp_Equal;
        instr->AsBranchInstr()->Invert();
        inverted = true;
    }
    else if(helperMethod == IR::HelperOp_NotStrictEqual)
    {
        // Op_NotStrictEqual() returns !Op_StrictEqual().  It is faster to call Op_StrictEqual() directly.
        helperMethod = IR::HelperOp_StrictEqual;
        instr->AsBranchInstr()->Invert();
        inverted = true;
    }

    if (loadScriptContext)
        LoadScriptContext(instr);

    opndSrc = instr->UnlinkSrc2();
    if (loadArg2)
        m_lowererMD.LoadHelperArgument(instr, opndSrc);

    opndSrc = instr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(instr, opndSrc);

    // Generate helper call to compare the source operands.

    opndHelper = IR::HelperCallOpnd::New(helperMethod, this->m_func);
    symDst = StackSym::New(TyMachReg, this->m_func);
    opndDst = IR::RegOpnd::New(symDst, TyMachReg, this->m_func);
    instrCall = IR::Instr::New(Js::OpCode::Call, opndDst, opndHelper, this->m_func);

    instr->InsertBefore(instrCall);
    instrCall = m_lowererMD.LowerCall(instrCall, 0);

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::BrSrNotNeq_A:
        if (instr->HasBailOutInfo())
        {
            instr->GetBailOutInfo()->isInvertedBranch = true;
        }
        break;

    case Js::OpCode::BrNotGe_A:
    case Js::OpCode::BrNotGt_A:
    case Js::OpCode::BrNotLe_A:
    case Js::OpCode::BrNotLt_A:
        inverted = true;
        break;
    }

    // Branch if the result is "true".

    instr->SetSrc1(opndDst);
    instr->m_opcode = (inverted ? Js::OpCode::BrFalse_A : Js::OpCode::BrTrue_A);
    this->LowerCondBranchCheckBailOut(instr->AsBranchInstr(), instrCall, !noMathFastPath && isHelper);

    return instrPrev;
}